

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  pointer pcVar1;
  int iVar2;
  IMutableContext *pIVar3;
  undefined4 extraout_var;
  
  pIVar3 = getCurrentMutableContext();
  iVar2 = (*(pIVar3->super_IContext)._vptr_IContext[2])(pIVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
            ((long *)CONCAT44(extraout_var,iVar2),this);
  pcVar1 = (this->m_info).message._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).message.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).lineInfo.file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).lineInfo.file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).macroName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).macroName.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
        getResultCapture().popScopedMessage( m_info );
    }